

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator=
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ExpressionResultBuilder *local_18;
  ExpressionResultBuilder *other_local;
  ExpressionResultBuilder *this_local;
  
  local_18 = other;
  other_local = this;
  AssertionResultData::operator=(&this->m_data,&other->m_data);
  ExprComponents::operator=(&this->m_exprComponents,&local_18->m_exprComponents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::__cxx11::ostringstream::str((string *)&this->m_stream);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::ostringstream::str();
  std::operator<<((ostream *)&this->m_stream,local_70);
  std::__cxx11::string::~string(local_70);
  return this;
}

Assistant:

ExpressionResultBuilder& ExpressionResultBuilder::operator=(ExpressionResultBuilder const& other ) {
        m_data = other.m_data;
        m_exprComponents = other.m_exprComponents;
        m_stream.str("");
        m_stream << other.m_stream.str();
        return *this;
    }